

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::CoreMLModels::WordTagger::SharedDtor(WordTagger *this)

{
  bool bVar1;
  string *psVar2;
  WordTagger *this_local;
  
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->language_,psVar2);
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->tokensoutputfeaturename_,psVar2)
  ;
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->tokentagsoutputfeaturename_,psVar2);
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->tokenlocationsoutputfeaturename_,psVar2);
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->tokenlengthsoutputfeaturename_,psVar2);
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->modelparameterdata_,psVar2);
  bVar1 = has_Tags(this);
  if (bVar1) {
    clear_Tags(this);
  }
  return;
}

Assistant:

void WordTagger::SharedDtor() {
  language_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  tokensoutputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  tokentagsoutputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  tokenlocationsoutputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  tokenlengthsoutputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  modelparameterdata_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (has_Tags()) {
    clear_Tags();
  }
}